

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

unsigned_short ndiGetBX2PortStatus(ndicapi *pol,int portHandle)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = pol->Bx2HandleCount;
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  do {
    if (uVar2 == uVar3) {
LAB_00108df7:
      if ((uint)uVar2 == uVar1) {
        return 0;
      }
      return pol->Bx2HandlesStatus[uVar2];
    }
    if ((uint)pol->Bx2Handles[uVar3] == portHandle) {
      uVar2 = uVar3 & 0xffffffff;
      goto LAB_00108df7;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

ndicapiExport unsigned short ndiGetBX2PortStatus(ndicapi* pol, int portHandle)
{
  int i, n;

  n = pol->Bx2HandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->Bx2Handles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  return pol->Bx2HandlesStatus[i];
}